

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

void __thiscall
glcts::ExtensionDirectiveTestCaseGroup::ExtensionDirectiveTestCase::ExtensionDirectiveTestCase
          (ExtensionDirectiveTestCase *this,Context *context,GLSLVersion glslVersion,char *behaviour
          )

{
  bool bVar1;
  string b;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"extension_directive_",&local_61);
  std::operator+(&local_60,&local_40,behaviour);
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,local_60._M_dataplus._M_p,"Test #extension directive.");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ExtensionDirectiveTestCase_01e05080;
  this->m_glslVersion = glslVersion;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_behaviourStr,behaviour,(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,behaviour,(allocator<char> *)&local_40);
  bVar1 = std::operator==(&local_60,"disable");
  bVar1 = !bVar1;
  if (bVar1) {
    std::operator==(&local_60,"enable");
  }
  this->m_requireInfoLog = !bVar1;
  this->m_requireCompile = bVar1;
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

ExtensionDirectiveTestCase(deqp::Context& context, glu::GLSLVersion glslVersion, const char* behaviour)
			: TestCase(context, (std::string("extension_directive_") + behaviour).c_str(), "Test #extension directive.")
			, m_glslVersion(glslVersion)
			, m_behaviourStr(behaviour)
		{
			// Initialize expected compiler behaviour.
			std::string b(behaviour);
			if (b == "disable")
			{
				m_requireInfoLog = true;
				m_requireCompile = false;
			}
			else if (b == "enable")
			{
				m_requireInfoLog = false;
				m_requireCompile = true;
			}
			else
			{
				DE_ASSERT(b == "warn");
				m_requireInfoLog = false;
				m_requireCompile = true;
			}
		}